

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelSolve::allocThread(ParallelSolve *this,uint32 id,Solver *s)

{
  ParallelHandler *this_00;
  ParallelHandler **ppPVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  size_t align;
  ulong uVar3;
  
  align = CONCAT44(in_register_00000034,id);
  if (this->thread_ == (ParallelHandler **)0x0) {
    uVar3 = (ulong)(this->shared_->threads).super___atomic_base<unsigned_int>._M_i << 3;
    ppPVar1 = (ParallelHandler **)operator_new__(uVar3);
    this->thread_ = ppPVar1;
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 8) {
      *(undefined8 *)((long)ppPVar1 + uVar2) = 0;
    }
  }
  this_00 = (ParallelHandler *)alignedAllocChecked(0x80,align);
  ParallelHandler::ParallelHandler(this_00,this,s);
  this->thread_[id] = this_00;
  return;
}

Assistant:

void ParallelSolve::allocThread(uint32 id, Solver& s) {
	if (!thread_) {
		uint32 n = numThreads();
		thread_  = new ParallelHandler*[n];
		std::fill(thread_, thread_+n, static_cast<ParallelHandler*>(0));
	}
	size_t sz   = ((sizeof(ParallelHandler)+63) / 64) * 64;
	thread_[id] = new (alignedAllocChecked(sz)) ParallelHandler(*this, s);
}